

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmInt.h
# Opt level: O2

Mpm_Cut_t * Mpm_ObjCutBestP(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  Mmr_Step_t *pMVar1;
  uint uVar2;
  void *pvVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar2 = Vec_IntEntry(&p->vCutBests,(uint)pObj->pFans[3] >> 1);
  pMVar1 = p->pManCuts;
  uVar5 = pMVar1->uMask & uVar2;
  if ((int)uVar5 < 1) {
    __assert_fail("(h & p->uMask) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/mem/mem2.h"
                  ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
  }
  uVar6 = (int)uVar2 >> ((byte)pMVar1->nBits & 0x1f);
  if (0 < (int)uVar6) {
    bVar4 = (byte)*(undefined4 *)((long)pMVar1 + (ulong)uVar5 * 0x38 + 0x18);
    if ((int)uVar6 < *(int *)((long)pMVar1 + (ulong)uVar5 * 0x38 + 0x34) << (bVar4 & 0x1f)) {
      pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)((long)pMVar1 + (ulong)uVar5 * 0x38 + 0x30),
                            uVar6 >> (bVar4 & 0x1f));
      uVar7 = (ulong)(uVar6 & *(uint *)((long)pMVar1 + (ulong)uVar5 * 0x38 + 0x1c));
      if ((*(uint *)((long)pvVar3 + uVar7 * 8 + 4) >> 0x19) + 0xc >> 3 ==
          (uVar2 & p->pManCuts->uMask)) {
        return (Mpm_Cut_t *)((long)pvVar3 + uVar7 * 8);
      }
      __assert_fail("Mpm_CutWordNum(pCut->nLeaves) == (h & p->pManCuts->uMask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmInt.h"
                    ,0xaf,"Mpm_Cut_t *Mpm_CutFetch(Mpm_Man_t *, int)");
    }
  }
  __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/mem/mem2.h"
                ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
}

Assistant:

static inline Mpm_Cut_t * Mpm_ObjCutBestP( Mpm_Man_t * p, Mig_Obj_t * pObj )             { return Mpm_CutFetch( p, Mpm_ObjCutBest(p, pObj) );              }